

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O3

FILE * f_open(Filename *filename,char *mode,_Bool is_private)

{
  int __fd;
  FILE *pFVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,is_private) == 0) {
    pFVar1 = fopen(filename->path,mode);
    return (FILE *)pFVar1;
  }
  if (*mode == 'w') {
    __fd = open(filename->path,0x241,0x180);
    if (-1 < __fd) {
      pFVar1 = fdopen(__fd,mode);
      return (FILE *)pFVar1;
    }
    return (FILE *)0x0;
  }
  __assert_fail("mode[0] == \'w\'",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/utils/filename.c"
                ,0x41,"FILE *f_open(const Filename *, const char *, _Bool)");
}

Assistant:

FILE *f_open(const Filename *filename, char const *mode, bool is_private)
{
    if (!is_private) {
        return fopen(filename->path, mode);
    } else {
        int fd;
        assert(mode[0] == 'w');        /* is_private is meaningless for read,
                                          and tricky for append */
        fd = open(filename->path, O_WRONLY | O_CREAT | O_TRUNC, 0600);
        if (fd < 0)
            return NULL;
        return fdopen(fd, mode);
    }
}